

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O1

libssh2_socket_t open_socket_to_openssh_server(void)

{
  bool bVar1;
  int iVar2;
  in_addr_t iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  int wait_time;
  uint uVar8;
  ulong uVar9;
  int attempt_no;
  uint uVar10;
  char *ip_address;
  char *port_string;
  char *local_58;
  char *local_50;
  char *local_48;
  sockaddr local_40;
  
  pcVar7 = running_container_id;
  local_58 = (char *)0x0;
  local_50 = (char *)0x0;
  if (have_docker == 0) {
    pcVar5 = getenv("OPENSSH_SERVER_HOST");
    pcVar7 = "127.0.0.1";
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
    }
    local_58 = strdup(pcVar7);
    pcVar5 = getenv("OPENSSH_SERVER_PORT");
    pcVar7 = "4711";
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
    }
LAB_001031c8:
    local_50 = strdup(pcVar7);
LAB_001031f2:
    pcVar7 = local_58;
    if ((local_58 != (char *)0x0) && (iVar2 = strcmp(local_58,"0.0.0.0"), iVar2 == 0)) {
      free(pcVar7);
      local_58 = strdup("127.0.0.1");
    }
    iVar3 = inet_addr(local_58);
    if (iVar3 == 0xffffffff) {
      open_socket_to_openssh_server_cold_2();
    }
    else {
      uVar8 = 1;
      iVar2 = socket(2,1,0);
      if (iVar2 == -1) {
        open_socket_to_openssh_server_cold_1();
      }
      else {
        local_40.sa_family = 2;
        lVar6 = strtol(local_50,(char **)0x0,0);
        local_40.sa_data._0_2_ = (ushort)lVar6 << 8 | (ushort)lVar6 >> 8;
        uVar9 = 0;
        local_40.sa_data._2_4_ = iVar3;
        do {
          iVar4 = connect(iVar2,&local_40,0x10);
          if (iVar4 == 0) goto LAB_001032d7;
          fprintf(_stderr,"Connection to %s:%s attempt #%d failed: retrying...\n",local_58,local_50,
                  uVar9);
          sleep(uVar8);
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar8 = uVar8 + 2;
        } while (uVar8 != 7);
        iVar2 = -1;
LAB_001032d7:
        if (iVar2 != -1) goto LAB_00103342;
        fprintf(_stderr,"Failed to connect to %s:%s\n",local_58,local_50);
      }
    }
  }
  else {
    pcVar5 = getenv("DOCKER_MACHINE_NAME");
    local_48 = pcVar7;
    if (pcVar5 == (char *)0x0) {
      iVar2 = is_running_inside_a_container();
      pcVar5 = "docker inspect --format \"{{ .NetworkSettings.IPAddress }}\" %s";
      if (iVar2 == 0) {
        pcVar5 = 
        "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostIp\\\" }}\" %s"
        ;
      }
      iVar2 = run_command(&local_58,pcVar5,pcVar7);
    }
    else {
      uVar8 = 500;
      uVar10 = 0;
      do {
        iVar2 = run_command(&local_58,"docker-machine ip %s",pcVar5);
        if (iVar2 == 0) {
          pcVar7 = (char *)0x0;
          bVar1 = false;
        }
        else if ((int)uVar10 < 6) {
          sleep(uVar8);
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 * 2;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          fprintf(_stderr,"Unable to get IP from docker-machine after %d attempts\n",(ulong)uVar10);
          pcVar7 = (char *)0xffffffff;
        }
        iVar2 = (int)pcVar7;
      } while (bVar1);
    }
    if (iVar2 == 0) {
      iVar2 = is_running_inside_a_container();
      pcVar7 = local_48;
      if (iVar2 != 0) {
        pcVar7 = "22";
        goto LAB_001031c8;
      }
      iVar2 = run_command(&local_50,
                          "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostPort\\\" }}\" %s"
                          ,local_48);
      if (iVar2 != 0) {
        pcVar5 = "Failed to get port for container %s\n";
        goto LAB_00103336;
      }
      goto LAB_001031f2;
    }
    pcVar5 = "Failed to get IP address for container %s\n";
    pcVar7 = local_48;
LAB_00103336:
    fprintf(_stderr,pcVar5,pcVar7);
  }
  iVar2 = -1;
LAB_00103342:
  free(local_58);
  free(local_50);
  return iVar2;
}

Assistant:

libssh2_socket_t open_socket_to_openssh_server(void)
{
    return open_socket_to_container(running_container_id);
}